

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# content-parser.c
# Opt level: O2

char * blogc_fix_description(char *paragraph)

{
  char cVar1;
  bool bVar2;
  bool bVar3;
  bc_string_t *str;
  long lVar4;
  char *pcVar5;
  char *suffix;
  bool bVar6;
  long lVar7;
  
  if (paragraph == (char *)0x0) {
    return (char *)0x0;
  }
  bVar3 = false;
  str = bc_string_new();
  bVar6 = false;
  lVar4 = 0;
  lVar7 = 0;
  do {
    cVar1 = paragraph[lVar7];
    if ((cVar1 == '\r') || (cVar1 == '\n')) {
LAB_00105d27:
      bVar2 = !bVar6;
      bVar6 = true;
      if (bVar2) {
        pcVar5 = bc_strndup(paragraph + lVar4,lVar7 - lVar4);
        suffix = bc_str_strip(pcVar5);
        bc_string_append(str,suffix);
        free(pcVar5);
        if (!bVar3) {
          bc_string_append_c(str,' ');
        }
        lVar4 = lVar7 + 1;
      }
    }
    else {
      if (cVar1 == '\0') {
        bVar3 = true;
        goto LAB_00105d27;
      }
      bVar6 = false;
    }
    lVar7 = lVar7 + 1;
    if (bVar3) {
      pcVar5 = bc_str_strip(str->str);
      pcVar5 = blogc_htmlentities(pcVar5);
      bc_string_free(str,true);
      return pcVar5;
    }
  } while( true );
}

Assistant:

char*
blogc_fix_description(const char *paragraph)
{
    if (paragraph == NULL)
        return NULL;
    bc_string_t *rv = bc_string_new();
    bool last = false;
    bool newline = false;
    char *tmp = NULL;
    size_t start = 0;
    size_t current = 0;
    while (true) {
        switch (paragraph[current]) {
            case '\0':
                last = true;
            case '\r':
            case '\n':
                if (newline)
                    break;
                tmp = bc_strndup(paragraph + start, current - start);
                bc_string_append(rv, bc_str_strip(tmp));
                free(tmp);
                tmp = NULL;
                if (!last)
                    bc_string_append_c(rv, ' ');
                start = current + 1;
                newline = true;
                break;
            default:
                newline = false;
        }
        if (last)
            break;
        current++;
    }
    tmp = blogc_htmlentities(bc_str_strip(rv->str));
    bc_string_free(rv, true);
    return tmp;
}